

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O1

void invtransall(int p,int q,int P,int Q,double *old,double *new1)

{
  if (p == 0) {
    p = 0;
  }
  else {
    arinvtrans(p,old,new1);
  }
  if (q != 0) {
    arinvtrans(q,old + p,new1 + p);
    p = p + q;
  }
  if (P != 0) {
    arinvtrans(P,old + p,new1 + p);
    p = p + P;
  }
  if (Q != 0) {
    arinvtrans(Q,old + p,new1 + p);
    return;
  }
  return;
}

Assistant:

void invtransall(int p, int q, int P, int Q, double *old, double *new1) {
	int N;

	N = 0;

	if (p != 0) {
		arinvtrans(p, old, new1);
		N = N + p;
	}

	if (q != 0) {
		arinvtrans(q, old + N, new1 + N);
		N = N + q;
	}

	if (P != 0) {
		arinvtrans(P, old + N, new1 + N);
		N = N + P;
	}

	if (Q != 0) {
		arinvtrans(Q, old + N, new1 + N);
	}
}